

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O3

int cpu_exec_tricore(uc_struct_conflict15 *uc,CPUState *cpu)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUClass *pCVar4;
  TranslationBlock *pTVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var9;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var10;
  CPUWatchpoint *pCVar11;
  _Bool _Var12;
  char cVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  TranslationBlock *pTVar19;
  TranslationBlock_conflict *pTVar20;
  TranslationBlock_conflict *pTVar21;
  uint cf_mask;
  CPUClass *pCVar22;
  TranslationBlock_conflict *pTVar23;
  uint32_t cflags;
  list_item *plVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  ulong local_50;
  undefined4 local_48;
  ulong local_40;
  undefined4 local_38;
  
  pCVar22 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar22->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var12 = (*pCVar22->has_work)((CPUState_conflict *)cpu);
    if (!_Var12) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar22->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar14 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar14 != 0) {
    pCVar22 = cpu->cc;
  }
LAB_00d10443:
  puVar2 = cpu->uc;
  uVar16 = cpu->exception_index;
  if (puVar2->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var12 = (*puVar2->stop_interrupt)(puVar2,uVar16);
    if (_Var12) {
      plVar24 = puVar2->hook[0xe].head;
      goto joined_r0x00d10ac4;
    }
    uVar16 = cpu->exception_index;
  }
  if (-1 < (int)uVar16) {
    if (0xffff < uVar16) {
      if (uVar16 == 0x10002) {
        pCVar4 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          for (pCVar11 = (cpu->watchpoints).tqh_first; pCVar11 != (CPUWatchpoint *)0x0;
              pCVar11 = (pCVar11->entry).tqe_next) {
            *(byte *)&pCVar11->flags = (byte)pCVar11->flags & 0x3f;
          }
        }
        (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_00d10b4d;
    }
    plVar24 = puVar2->hook[0].head;
    if (plVar24 == (list_item *)0x0) goto LAB_00d10aa3;
    bVar25 = false;
    do {
      pvVar3 = plVar24->data;
      if (pvVar3 == (void *)0x0) break;
      if (*(char *)((long)pvVar3 + 0x14) == '\0') {
        (**(code **)((long)pvVar3 + 0x28))
                  (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
        bVar25 = true;
      }
      plVar24 = plVar24->next;
    } while (plVar24 != (list_item *)0x0);
    if (!bVar25) goto LAB_00d10aa3;
    cpu->exception_index = -1;
  }
  pTVar21 = (TranslationBlock_conflict *)0x0;
  pTVar20 = pTVar21;
  while( true ) {
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x72a) = 0;
    uVar16 = cpu->interrupt_request;
    if (uVar16 != 0) {
      uVar15 = uVar16;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar15 = uVar16 & 0xffffeda5;
      }
      if ((char)uVar15 < '\0') {
        cpu->interrupt_request = uVar16 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_00d10443;
      }
      if ((uVar15 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_00d10443;
      }
      _Var12 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar15);
      if (_Var12) {
        cpu->exception_index = -1;
        pTVar20 = (TranslationBlock_conflict *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar20 = (TranslationBlock_conflict *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    cflags = cpu->cflags_next_tb;
    if (cflags == 0xffffffff) {
      cflags = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    puVar2 = cpu->uc;
    uVar16 = *(uint *)((long)cpu->env_ptr + 0x9c);
    uVar15 = uVar16 >> 8 ^ uVar16;
    uVar15 = uVar15 & 0x3f | uVar15 >> 8 & 0xfc0;
    pTVar19 = cpu->tb_jmp_cache[uVar15];
    cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
    if (((((pTVar19 == (TranslationBlock *)0x0) || ((uint)pTVar19->pc != uVar16)) ||
         (*(int *)((long)&pTVar19->pc + 4) != 0)) ||
        (((int)pTVar19->cs_base != 0 ||
         (uVar1._0_2_ = pTVar19->size, uVar1._2_2_ = pTVar19->icount,
         cpu->trace_dstate[0] != (ulong)uVar1)))) || ((pTVar19->flags & 0xff0effff) != cf_mask)) {
      pTVar19 = tb_htable_lookup_tricore(cpu,(ulong)uVar16,0,0,cf_mask);
      if (pTVar19 == (TranslationBlock *)0x0) {
        pTVar19 = (TranslationBlock *)tb_gen_code_tricore(cpu,uVar16,0,0,cflags);
        cpu->tb_jmp_cache[uVar15] = pTVar19;
        pTVar5 = puVar2->last_tb;
        if (pTVar5 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar19->pc;
          auVar26 = ZEXT416(*(uint *)((long)&pTVar19->cs_base + 4));
          auVar26 = pshuflw(auVar26,auVar26,0xe1);
          local_38 = auVar26._0_4_;
          local_50 = (ulong)(uint)pTVar5->pc;
          auVar26 = ZEXT416(*(uint *)((long)&pTVar5->cs_base + 4));
          auVar26 = pshuflw(auVar26,auVar26,0xe1);
          local_48 = auVar26._0_4_;
          for (plVar24 = puVar2->hook[0xf].head;
              (plVar24 != (list_item *)0x0 && (pvVar3 = plVar24->data, pvVar3 != (void *)0x0));
              plVar24 = plVar24->next) {
            if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
               (uVar17 = (ulong)(uint)pTVar19->pc,
               *(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
               uVar17 <= *(ulong *)((long)pvVar3 + 0x20) &&
               *(ulong *)((long)pvVar3 + 0x18) <= uVar17)) {
              (**(code **)((long)pvVar3 + 0x28))
                        (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar15] = pTVar19;
      }
    }
    if ((pTVar20 != (TranslationBlock_conflict *)0x0) &&
       (pTVar19->page_addr[0] == 0xffffffffffffffff)) {
      if (1 < (uint)pTVar21) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar19->flags & 0x40000) == 0) {
        LOCK();
        bVar25 = pTVar20->jmp_dest[(long)pTVar21] == 0;
        if (bVar25) {
          pTVar20->jmp_dest[(long)pTVar21] = (uintptr_t)pTVar19;
        }
        UNLOCK();
        if (bVar25) {
          pvVar3 = (pTVar20->tc).ptr;
          *(uint32_t *)(pTVar20->jmp_target_arg[(long)pTVar21] + (long)pvVar3) =
               (pTVar19->cflags - ((int)pTVar20->jmp_target_arg[(long)pTVar21] + (int)pvVar3)) + -4;
          pTVar20->jmp_list_next[(long)pTVar21] = pTVar19->jmp_target_arg[1];
          pTVar19->jmp_target_arg[1] = (ulong)pTVar20 | (ulong)pTVar21;
        }
      }
    }
    if (cpu->exit_request == false) {
      uVar6._0_4_ = pTVar19->cflags;
      uVar6._4_4_ = pTVar19->trace_vcpu_dstate;
      pvVar3 = cpu->env_ptr;
      tb_exec_lock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
      uVar17 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x2c8) + 0x2e8) + 0x90))
                         (pvVar3,uVar6);
      if (cpu->uc->nested_level == 1) {
        tb_exec_unlock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
      }
      cpu->can_do_io = 1;
      pTVar23 = (TranslationBlock_conflict *)(uVar17 & 0xfffffffffffffffc);
      if ((uVar17 & 2) != 0) {
        if (*(long *)(*(long *)((long)pvVar3 + 0x2c8) + 0x358) == 0) {
          uVar16 = *(uint *)(*(long *)((long)pvVar3 + 0x2c8) + 0x578);
          if (((0x12 < uVar16) || ((0x771c0U >> (uVar16 & 0x1f) & 1) == 0)) &&
             (cpu->uc->quit_request == false)) {
            p_Var9 = cpu->cc->synchronize_from_tb;
            if (p_Var9 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
              p_Var10 = cpu->cc->set_pc;
              if (p_Var10 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00d10b9f;
              (*p_Var10)((CPUState_conflict *)cpu,(ulong)pTVar23->pc);
            }
            else {
              (*p_Var9)((CPUState_conflict *)cpu,pTVar23);
            }
          }
        }
        cpu->tcg_exit_req = 0;
      }
      cpu->uc->last_tb = pTVar19;
      uVar16 = (uint)uVar17 & 3;
      pTVar21 = (TranslationBlock_conflict *)(ulong)uVar16;
      pTVar20 = pTVar23;
      if ((uVar16 == 3) &&
         (pTVar21 = (TranslationBlock_conflict *)0x3, pTVar20 = (TranslationBlock_conflict *)0x0,
         -1 < *(int *)(cpu[1].tb_jmp_cache + 0xe5))) {
        lVar7 = cpu->icount_budget;
        lVar18 = 0xffff;
        if (lVar7 < 0xffff) {
          lVar18 = lVar7;
        }
        uVar16 = (uint)lVar18;
        *(short *)(cpu[1].tb_jmp_cache + 0xe5) = (short)lVar18;
        cpu->icount_extra = lVar7 - (int)uVar16;
        pTVar20 = (TranslationBlock_conflict *)0x0;
        pTVar21 = (TranslationBlock_conflict *)0x3;
        if (0 < (int)uVar16 && lVar7 - (int)uVar16 == 0) {
          uVar15 = 0x7fff;
          if (uVar16 < 0x7fff) {
            uVar15 = uVar16;
          }
          pTVar19 = (TranslationBlock *)
                    tb_gen_code_tricore(cpu,pTVar23->pc,pTVar23->cs_base,pTVar23->flags,
                                        uVar15 | 0x10000);
          (pTVar19->tc).size = (size_t)pTVar23;
          uVar8._0_4_ = pTVar19->cflags;
          uVar8._4_4_ = pTVar19->trace_vcpu_dstate;
          pvVar3 = cpu->env_ptr;
          tb_exec_lock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
          uVar17 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x2c8) + 0x2e8) + 0x90))
                             (pvVar3,uVar8);
          if (cpu->uc->nested_level == 1) {
            tb_exec_unlock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
          }
          cpu->can_do_io = 1;
          if ((uVar17 & 2) != 0) {
            if (*(long *)(*(long *)((long)pvVar3 + 0x2c8) + 0x358) == 0) {
              uVar16 = *(uint *)(*(long *)((long)pvVar3 + 0x2c8) + 0x578);
              if (((0x12 < uVar16) || ((0x771c0U >> (uVar16 & 0x1f) & 1) == 0)) &&
                 (cpu->uc->quit_request == false)) {
                p_Var9 = cpu->cc->synchronize_from_tb;
                if (p_Var9 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                  p_Var10 = cpu->cc->set_pc;
                  if (p_Var10 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00d10b9f:
                    __assert_fail("cc->set_pc",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                  ,0x61,
                                  "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
                  }
                  (*p_Var10)((CPUState_conflict *)cpu,
                             (ulong)((TranslationBlock_conflict *)(uVar17 & 0xfffffffffffffffc))->pc
                            );
                }
                else {
                  (*p_Var9)((CPUState_conflict *)cpu,
                            (TranslationBlock_conflict *)(uVar17 & 0xfffffffffffffffc));
                }
              }
            }
            cpu->tcg_exit_req = 0;
          }
          tb_phys_invalidate_tricore
                    ((TCGContext_conflict9 *)cpu->uc->tcg_ctx,(TranslationBlock_conflict *)pTVar19,
                     0xffffffffffffffff);
          tcg_tb_remove_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx,pTVar19);
          pTVar20 = (TranslationBlock_conflict *)0x0;
          pTVar21 = (TranslationBlock_conflict *)0x3;
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_00d10443;
joined_r0x00d10ac4:
  if ((plVar24 == (list_item *)0x0) || (pvVar3 = plVar24->data, pvVar3 == (void *)0x0))
  goto LAB_00d10aee;
  if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
     (cVar13 = (**(code **)((long)pvVar3 + 0x28))(puVar2,*(undefined8 *)((long)pvVar3 + 0x30)),
     cVar13 != '\0')) goto LAB_00d10af9;
  plVar24 = plVar24->next;
  goto joined_r0x00d10ac4;
LAB_00d10aee:
  puVar2->invalid_error = 10;
  goto LAB_00d10af9;
LAB_00d10aa3:
  puVar2->invalid_error = 0x15;
  cpu->halted = 1;
LAB_00d10af9:
  uVar16 = 0x10001;
LAB_00d10b4d:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar22->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar16;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}